

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kcm_mixer.c
# Opt level: O1

_Bool al_set_mixer_quality(ALLEGRO_MIXER *mixer,ALLEGRO_MIXER_QUALITY new_quality)

{
  _Bool _Var1;
  
  if ((mixer->ss).mutex != (ALLEGRO_MUTEX *)0x0) {
    al_lock_mutex();
  }
  _Var1 = true;
  if (mixer->quality != new_quality) {
    if ((mixer->streams)._size == 0) {
      mixer->quality = new_quality;
    }
    else {
      _al_set_error(2,"Attempted to change the quality of a mixer with attachments");
      _Var1 = false;
    }
  }
  if ((mixer->ss).mutex != (ALLEGRO_MUTEX *)0x0) {
    al_unlock_mutex();
  }
  return _Var1;
}

Assistant:

bool al_set_mixer_quality(ALLEGRO_MIXER *mixer, ALLEGRO_MIXER_QUALITY new_quality)
{
   bool ret;
   ASSERT(mixer);

   maybe_lock_mutex(mixer->ss.mutex);

   if (mixer->quality == new_quality) {
      ret = true;
   }
   else if (_al_vector_size(&mixer->streams) == 0) {
      mixer->quality = new_quality;
      ret = true;
   }
   else {
      _al_set_error(ALLEGRO_INVALID_OBJECT,
         "Attempted to change the quality of a mixer with attachments");
      ret = false;
   }

   maybe_unlock_mutex(mixer->ss.mutex);

   return ret;
}